

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O0

void __thiscall GraphEdit::GraphEdit(GraphEdit *this,GraphModel *model,QWidget *parent)

{
  QWidget *pQVar1;
  QWidget *signal;
  Object local_88;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [40];
  QWidget *local_28;
  QWidget *_viewport;
  QWidget *parent_local;
  GraphModel *model_local;
  GraphEdit *this_local;
  
  _viewport = parent;
  parent_local = (QWidget *)model;
  model_local = (GraphModel *)this;
  QAbstractScrollArea::QAbstractScrollArea(&this->super_QAbstractScrollArea,parent);
  *(undefined ***)this = &PTR_metaObject_002d6580;
  *(undefined ***)&this->field_0x10 = &PTR__GraphEdit_002d6758;
  this->mModel = (GraphModel *)parent_local;
  this->mMode = WaveformView;
  QRect::QRect(&this->mPlotRect);
  this->mBarMode = false;
  this->mLines = true;
  this->mMinValue = 0;
  this->mMaxValue = 0;
  this->mCellWidth = 0;
  this->mCellHeight = 0;
  this->mAlternateInterval = 0;
  std::optional<QPoint>::optional(&this->mMouseOver);
  QPoint::QPoint(&this->mLastMouseCoords);
  QColor::QColor(&this->mBackgroundColor);
  QColor::QColor(&this->mAlternateColor);
  QColor::QColor(&this->mLineColor);
  QColor::QColor(&this->mSampleColor);
  local_28 = (QWidget *)QAbstractScrollArea::viewport();
  QWidget::setMouseTracking(local_28,true);
  local_50._12_16_ = (undefined1  [16])QWidget::rect(local_28);
  this->mPlotRect = (QRect)local_50._12_16_;
  QRect::adjust(&this->mPlotRect,8,8,-8,-8);
  signal = parent_local;
  pQVar1 = local_28;
  local_60 = QWidget::update;
  local_58 = 0;
  local_88._8_8_ =
       QNonConstOverload<>::operator()
                 ((QNonConstOverload<> *)&qOverload<>,(Function)QWidget::update);
  local_70 = GraphModel::dataChanged;
  local_68 = 0;
  QObject::connect<void(GraphModel::*)(),void(QWidget::*)()>
            ((Object *)local_50,(offset_in_GraphModel_to_subr)signal,
             (Object *)GraphModel::dataChanged,0,(ConnectionType)pQVar1);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect<void(GraphModel::*)(int),GraphEdit::GraphEdit(GraphModel&,QWidget*)::__0>
            (&local_88,(offset_in_GraphModel_to_subr)parent_local,
             (QObject *)GraphModel::countChanged,(anon_class_8_1_8991fb9c_for_function)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_88);
  calculateAxis(this);
  setViewModeImpl(this,this->mMode);
  return;
}

Assistant:

GraphEdit::GraphEdit(GraphModel &model, QWidget *parent) :
    QAbstractScrollArea(parent),
    mModel(model),
    mMode(GraphEdit::WaveformView),
    mBarMode(false),
    mLines(true),
    mMinValue(0),
    mMaxValue(0),
    mCellWidth(0),
    mCellHeight(0),
    mAlternateInterval(0),
    mMouseOver()
{
    auto _viewport = viewport();
    _viewport->setMouseTracking(true);
    mPlotRect = _viewport->rect();
    mPlotRect.adjust(TU::PADDING_X, TU::PADDING_Y, -TU::PADDING_X, -TU::PADDING_Y);

    connect(&model, &GraphModel::dataChanged, _viewport, qOverload<>(&QWidget::update));
    connect(&model, &GraphModel::countChanged, this,
        [this](int count) {
            Q_UNUSED(count)
            calculateCellWidth();
            viewport()->update();
        });

    calculateAxis();
    setViewModeImpl(mMode);
}